

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderMatrixCase::ShaderMatrixCase
          (ShaderMatrixCase *this,Context *context,char *name,char *desc,ShaderInput *in0,
          ShaderInput *in1,MatrixOp op,bool isVertexCase)

{
  DataType DVar1;
  MatrixShaderEvalFunc evalFunc;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderMatrixCase_01e2bf88;
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,desc,isVertexCase,
             &(this->m_matEvaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderMatrixCase_01e2bf88;
  DVar1 = in0->dataType;
  (this->m_in0).inputType = in0->inputType;
  (this->m_in0).dataType = DVar1;
  (this->m_in0).precision = in0->precision;
  DVar1 = in1->dataType;
  (this->m_in1).inputType = in1->inputType;
  (this->m_in1).dataType = DVar1;
  (this->m_in1).precision = in1->precision;
  this->m_op = op;
  evalFunc = MatrixCaseUtils::getEvalFunc(in0,in1,op);
  MatrixShaderEvaluator::MatrixShaderEvaluator
            (&this->m_matEvaluator,evalFunc,in0->inputType,in1->inputType);
  return;
}

Assistant:

ShaderMatrixCase::ShaderMatrixCase (Context& context, const char* name, const char* desc, const ShaderInput& in0, const ShaderInput& in1, MatrixOp op, bool isVertexCase)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, desc, isVertexCase, m_matEvaluator)
	, m_in0				(in0)
	, m_in1				(in1)
	, m_op				(op)
	, m_matEvaluator	(getEvalFunc(in0, in1, op), in0.inputType, in1.inputType)
{
}